

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O0

void LongReadsDatastore::build_from_fastq
               (string *output_file,string *default_name,string *long_read_file,size_t min_size,
               int rle)

{
  initializer_list<ReadPosSize> __l;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int *piVar4;
  char *pcVar5;
  runtime_error *prVar6;
  ulong uVar7;
  reference pcVar8;
  long lVar9;
  streamoff sVar10;
  ostream *poVar11;
  size_type sVar12;
  ostream *poVar13;
  FastqReader<FastqRecord> *this;
  ulong in_RCX;
  string *in_RDX;
  string *in_RDI;
  int in_R8D;
  undefined1 auVar14 [16];
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> mappings;
  uint8_t k;
  pos_type offset;
  uint32_t size;
  char c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  int run_size;
  char last_char;
  string rleseq;
  FastqRecord rec;
  FastqReader<FastqRecord> reader;
  ifstream fastq_ifstream;
  SDG_FILETYPE type;
  uint64_t fPos;
  ofstream ofs;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> read_to_file_record;
  uint64_t nReads;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff828;
  FastqRecord *in_stack_fffffffffffff830;
  string *in_stack_fffffffffffff838;
  FastqRecord *in_stack_fffffffffffff840;
  FastqReader<FastqRecord> *in_stack_fffffffffffff848;
  allocator_type *in_stack_fffffffffffff858;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> *in_stack_fffffffffffff860;
  iterator in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  char *in_stack_fffffffffffff878;
  string *in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 uVar15;
  string *psVar16;
  FastxReaderParams params;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined1 local_6c1;
  fpos local_6c0 [16];
  streamoff local_6b0;
  undefined1 local_6a8 [16];
  undefined4 local_698;
  char local_691;
  undefined8 local_690;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_688;
  undefined1 *local_680;
  int local_678;
  char local_671;
  string local_670 [104];
  undefined1 local_608 [68];
  undefined4 local_5c4;
  undefined1 local_4e1;
  string local_4e0 [32];
  long local_4c0 [65];
  undefined2 local_2b2;
  streamoff local_2b0;
  undefined1 local_2a1;
  string local_2a0 [32];
  long local_280 [67];
  ReadPosSize local_68;
  ReadPosSize *local_58;
  undefined8 local_50;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> local_48;
  long local_30;
  int local_24;
  ulong local_20;
  string *local_18;
  string *local_8;
  
  local_30 = 1;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  ReadPosSize::ReadPosSize(&local_68,0,0);
  local_50 = 1;
  local_58 = &local_68;
  std::allocator<ReadPosSize>::allocator((allocator<ReadPosSize> *)0x3d4545);
  __l._M_len = (size_type)in_stack_fffffffffffff870;
  __l._M_array = in_stack_fffffffffffff868;
  std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::vector
            (in_stack_fffffffffffff860,__l,in_stack_fffffffffffff858);
  std::allocator<ReadPosSize>::~allocator((allocator<ReadPosSize> *)0x3d4579);
  psVar16 = local_8;
  _Var3 = std::operator|(_S_out,_S_trunc);
  _Var3 = std::operator|(_Var3,_S_bin);
  std::ofstream::ofstream(local_280,psVar16,_Var3);
  params.min_length = (uint32_t)((ulong)psVar16 >> 0x20);
  bVar1 = std::ios::operator!((ios *)((long)local_280 + *(long *)(local_280[0] + -0x18)));
  uVar15 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff8e8);
  if ((bVar1 & 1) != 0) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Failed to open output in ");
    poVar11 = std::operator<<(poVar11,local_8);
    poVar11 = std::operator<<(poVar11,": ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar11,pcVar5);
    local_2a1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    std::runtime_error::runtime_error(prVar6,local_2a0);
    local_2a1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::write((char *)local_280,0x56761e);
  std::ostream::write((char *)local_280,0x567620);
  local_2b2 = 4;
  std::ostream::write((char *)local_280,(long)&local_2b2);
  std::ostream::write((char *)local_280,(long)&local_30);
  std::ostream::write((char *)local_280,(long)&local_2b0);
  sdglib::write_string((ofstream *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  std::ifstream::ifstream(local_4c0,local_18,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_4c0 + *(long *)(local_4c0[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Failed to open input in ");
    poVar11 = std::operator<<(poVar11,local_18);
    poVar11 = std::operator<<(poVar11,": ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar11,pcVar5);
    local_4e1 = 1;
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
    std::runtime_error::runtime_error(prVar6,local_4e0);
    local_4e1 = 0;
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_5c4 = 0;
  FastqReader<FastqRecord>::FastqReader
            ((FastqReader<FastqRecord> *)CONCAT44(_Var3,uVar15),params,in_stack_fffffffffffff8e0);
  FastqRecord::FastqRecord(in_stack_fffffffffffff830);
  do {
    bVar2 = FastqReader<FastqRecord>::next_record
                      (in_stack_fffffffffffff848,in_stack_fffffffffffff840);
    if (!bVar2) {
      local_6c0 = (fpos  [16])std::ostream::tellp();
      sVar10 = std::fpos::operator_cast_to_long(local_6c0);
      local_2b0 = sVar10;
      sdglib::write_flat_vector<ReadPosSize>
                ((ofstream *)in_stack_fffffffffffff840,
                 (vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)in_stack_fffffffffffff838);
      local_6c1 = 0;
      std::ostream::write((char *)local_280,(long)&local_6c1);
      std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
                ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3d4dfc);
      sdglib::write_flat_vector<LongReadMapping>
                ((ofstream *)in_stack_fffffffffffff840,
                 (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
                 in_stack_fffffffffffff838);
      std::fpos<__mbstate_t>::fpos
                ((fpos<__mbstate_t> *)in_stack_fffffffffffff830,(streamoff)in_stack_fffffffffffff828
                );
      std::ostream::seekp(local_280,local_6f0,local_6e8);
      std::ostream::write((char *)local_280,(long)&local_30);
      std::ostream::write((char *)local_280,(long)&local_2b0);
      std::ostream::flush();
      poVar11 = sdglib::OutputLog((LogLevels)((ulong)sVar10 >> 0x20),SUB81((ulong)sVar10 >> 0x18,0))
      ;
      poVar11 = std::operator<<(poVar11,"Built datastore with ");
      sVar12 = std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::size(&local_48);
      poVar13 = (ostream *)std::ostream::operator<<(poVar11,sVar12 - 1);
      this = (FastqReader<FastqRecord> *)std::operator<<(poVar13," reads");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::~vector
                ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)poVar11);
      FastqRecord::~FastqRecord((FastqRecord *)this);
      FastqReader<FastqRecord>::~FastqReader(this);
      std::ifstream::~ifstream(local_4c0);
      std::ofstream::~ofstream(local_280);
      std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::~vector
                ((vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)poVar11);
      return;
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      if (local_20 != 0) {
        uVar7 = std::__cxx11::string::size();
        if (uVar7 < local_20) goto LAB_003d4d42;
      }
      std::__cxx11::string::string(local_670);
      std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)local_670);
      local_671 = ' ';
      local_678 = 0;
      local_680 = local_608;
      local_688._M_current = (char *)std::__cxx11::string::begin();
      local_690 = std::__cxx11::string::end();
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        if (!bVar2) break;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_688);
        local_691 = *pcVar8;
        switch(local_691) {
        case 'A':
        case 'C':
        case 'G':
        case 'T':
          break;
        default:
          local_691 = 'N';
          break;
        case 'a':
          local_691 = 'A';
          break;
        case 'c':
          local_691 = 'C';
          break;
        case 'g':
          local_691 = 'G';
          break;
        case 't':
          local_691 = 'T';
        }
        if (local_24 == 0) {
          std::__cxx11::string::push_back((char)local_670);
        }
        else {
          if (local_691 == local_671) {
            local_678 = local_678 + 1;
          }
          else {
            local_671 = local_691;
            local_678 = 1;
          }
          if (local_678 <= local_24) {
            std::__cxx11::string::push_back((char)local_670);
          }
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_688);
      }
      local_698 = std::__cxx11::string::size();
      auVar14 = std::ostream::tellp();
      local_6a8 = auVar14;
      local_6b0 = std::fpos::operator_cast_to_long((fpos *)local_6a8);
      std::vector<ReadPosSize,std::allocator<ReadPosSize>>::emplace_back<long,unsigned_int&>
                ((vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)in_stack_fffffffffffff840,
                 (long *)in_stack_fffffffffffff838,(uint *)in_stack_fffffffffffff830);
      lVar9 = std::__cxx11::string::c_str();
      std::ostream::write((char *)local_280,lVar9);
      std::__cxx11::string::~string(local_670);
    }
LAB_003d4d42:
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void LongReadsDatastore::build_from_fastq(const std::string &output_file, const std::string &default_name, const std::string &long_read_file, size_t min_size, int rle) {
    uint64_t nReads(1);
    std::vector<ReadPosSize> read_to_file_record{ReadPosSize{0,0}};
    std::ofstream ofs(output_file, std::ios_base::out | std::ios_base::trunc | std::ios_base::binary);
    if (!ofs) {
        std::cerr << "Failed to open output in " << output_file <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_file);
    }
    uint64_t fPos;
    ofs.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    ofs.write((const char *) &SDG_VN, sizeof(min_compat));
    SDG_FILETYPE type(LongDS_FT);
    ofs.write((char *) &type, sizeof(type));

    ofs.write((char*) &nReads, sizeof(nReads));
    ofs.write((char*) &fPos, sizeof(fPos));

    sdglib::write_string(ofs, default_name);

    std::ifstream fastq_ifstream(long_read_file);
    if (!fastq_ifstream) {
        std::cerr << "Failed to open input in " << long_read_file << ": " << strerror(errno);
        throw std::runtime_error("Could not open " + long_read_file);
    }
    FastqReader<FastqRecord> reader({}, long_read_file);
    FastqRecord rec;
    while(reader.next_record(rec)) {
        if (!rec.seq.empty() and (min_size==0 or rec.seq.size()>=min_size)) {

            std::string rleseq;
            rleseq.reserve(rec.seq.size());
            char last_char=' ';
            int run_size=0;

            for (auto c:rec.seq){
                switch (c){
                    case 'A':
                    case 'C':
                    case 'G':
                    case 'T':
                        break;
                    case 'a':
                        c='A';
                        break;
                    case 'c':
                        c='C';
                        break;
                    case 'g':
                        c='G';
                        break;
                    case 't':
                        c='T';
                        break;
                    default:
                        c='N';
                }
                if (rle==0) {
                    rleseq.push_back(c);
                }
                else {
                    if (c==last_char) {
                        ++run_size;
                    }
                    else {
                        last_char=c;
                        run_size=1;
                    }
                    if (run_size<=rle) rleseq.push_back(c);
                }
            }

            uint32_t size = rleseq.size();
            auto offset = ofs.tellp();
            read_to_file_record.emplace_back((off_t)offset,size);
            ofs.write((char*)rleseq.c_str(), size+1);//+1 writes the \0

        }
        ++nReads;
    }
    fPos = ofs.tellp();                             // Write position after reads
    sdglib::write_flat_vector(ofs, read_to_file_record);

    // Write empty mappings
    uint8_t k(0);
    ofs.write(reinterpret_cast<const char *>(&k), sizeof(k));
    std::vector<LongReadMapping> mappings;
    sdglib::write_flat_vector(ofs, mappings);

    ofs.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type));                                   // Go to top and dump # reads and position of index
    ofs.write((char*) &nReads, sizeof(nReads));     // Dump # of reads
    ofs.write((char*) &fPos, sizeof(fPos));         // Dump index

    ofs.flush();                                    // Make sure everything has been written
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Built datastore with "<<read_to_file_record.size()-1<<" reads"<<std::endl;
}